

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void __thiscall Imf_2_5::Header::setVersion(Header *this,int version)

{
  ArgExc *this_00;
  int version_local;
  TypedAttribute<int> local_20;
  
  version_local = version;
  if (version == 1) {
    TypedAttribute<int>::TypedAttribute(&local_20,&version_local);
    insert(this,"version",&local_20.super_Attribute);
    Attribute::~Attribute(&local_20.super_Attribute);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"We can only process version 1");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
Header::setVersion(const int version)
{
    if (version != 1)
    {
        throw IEX_NAMESPACE::ArgExc ("We can only process version 1");
    }

    insert ("version", IntAttribute (version));
}